

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

void char_update(void)

{
  long *plVar1;
  byte *pbVar2;
  undefined2 uVar3;
  CHAR_DATA *pCVar4;
  ROOM_INDEX_DATA *pRVar5;
  PC_DATA *pPVar6;
  AFFECT_DATA *pAVar7;
  bool bVar8;
  byte bVar9;
  float fVar10;
  bool bVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  OBJ_DATA *obj;
  CClass *pCVar15;
  CHAR_DATA *pCVar16;
  AFFECT_DATA *paf;
  char *pcVar17;
  CProficiencies *this;
  CHAR_DATA *pCVar18;
  string_view fmt;
  char buf1 [4608];
  
  bVar8 = 1 < save_number;
  save_number = save_number + 1;
  if (bVar8) {
    save_number = 0;
  }
  pCVar16 = char_list;
  if (char_list != (CHAR_DATA *)0x0) {
    bVar8 = false;
    pCVar18 = char_list;
    do {
      pCVar4 = pCVar18->next;
      bVar11 = is_npc(pCVar18);
      if (((((!bVar11) || (1 < (ushort)(sun - 1U))) || (pCVar18->in_room == (ROOM_INDEX_DATA *)0x0))
          || ((iVar13 = number_percent(), 0x59 < iVar13 ||
              (bVar11 = is_affected_by(pCVar18,0x11), bVar11)))) ||
         (pCVar18->fighting != (CHAR_DATA *)0x0)) {
        bVar11 = is_npc(pCVar18);
        if (((bVar11) && (2 < sun)) &&
           ((pCVar18->in_room != (ROOM_INDEX_DATA *)0x0 &&
            ((iVar13 = number_percent(), iVar13 < 0x5a && (pCVar18->fighting == (CHAR_DATA *)0x0))))
           )) {
          if (((pCVar18->act[0] & 0x80000000) == 0) ||
             (bVar11 = is_affected_by(pCVar18,0x1e), !bVar11)) {
            bVar9 = (byte)pCVar18->act[1] & 1;
            goto joined_r0x002c7193;
          }
          goto LAB_002c76ed;
        }
      }
      else if (((pCVar18->act[1] & 1) == 0) || (bVar11 = is_affected_by(pCVar18,0x1e), !bVar11)) {
        bVar9 = *(byte *)((long)pCVar18->act + 3) & 0x80;
joined_r0x002c7193:
        if ((bVar9 != 0) && (bVar11 = is_affected_by(pCVar18,0x1e), !bVar11)) {
          pbVar2 = (byte *)((long)pCVar18->affected_by + 3);
          *pbVar2 = *pbVar2 | 0x40;
        }
      }
      else {
LAB_002c76ed:
        pbVar2 = (byte *)((long)pCVar18->affected_by + 3);
        *pbVar2 = *pbVar2 & 0xbf;
      }
      if (0 < pCVar18->pause) {
        pCVar18->pause = pCVar18->pause + -1;
      }
      bVar11 = is_npc(pCVar18);
      if (((bVar11) && (pCVar18->hit < 0)) && (pCVar18->in_room != (ROOM_INDEX_DATA *)0x0)) {
        fmt._M_str = "{} in {} has HP {}";
        fmt._M_len = 0x12;
        CLogger::Warn<char*&,short&,int&>
                  ((CLogger *)&RS.field_0x140,fmt,&pCVar18->name,&pCVar18->in_room->vnum,
                   &pCVar18->hit);
      }
      sVar12 = pCVar18->ghost;
      if (0 < sVar12) {
        pCVar18->ghost = sVar12 + -1;
        if (sVar12 == 1) {
          pcVar17 = "You are no longer a ghost.\n\r";
        }
        else {
          pcVar17 = "Your body starts to collect itself.\n\r";
          if (sVar12 != 5) {
            if (sVar12 != 3) goto LAB_002c6de4;
            pcVar17 = "Your body begins to solidify.\n\r";
          }
        }
        send_to_char(pcVar17,pCVar18);
      }
LAB_002c6de4:
      if (0 < pCVar18->bounty_timer) {
        pCVar18->bounty_timer = pCVar18->bounty_timer + -1;
      }
      if (0 < pCVar18->ghost) {
        bVar8 = true;
      }
      bVar11 = is_npc(pCVar18);
      if (((!bVar11) && (pCVar18->level < 0x14)) &&
         ((ushort)(pCVar18->in_room->vnum + 0x9fe8U) < 0xff9c)) {
        sVar12 = pCVar18->level;
        while (sVar12 < 0x14) {
          pCVar18->level = sVar12 + 1;
          advance_level(pCVar18,true);
          sVar12 = pCVar18->level;
        }
        iVar13 = exp_per_level(pCVar18);
        pCVar18->exp = (pCVar18->level + -1) * iVar13;
        colorconv(buf1,"{RYou feel more experienced as you depart the Adventurer\'s Academy!{x\n\r",
                  pCVar18);
        send_to_char(buf1,pCVar18);
        colorconv(buf1,"{GYou are now level 20.{x\n\r",pCVar18);
        send_to_char(buf1,pCVar18);
        if (pCVar18->pet != (CHAR_DATA *)0x0) {
          sprintf(buf1,
                  "Remember, you can ask your familiar questions.  For example, \'say %s, how do I get to my guild?\'.\n\r"
                  ,pCVar18->pet->short_descr);
          send_to_char(buf1,pCVar18);
        }
      }
      bVar11 = is_npc(pCVar18);
      if (!bVar11) {
        if (pCVar18->pcdata == (PC_DATA *)0x0) {
          this = &prof_none;
        }
        else {
          this = &pCVar18->pcdata->profs;
        }
        CProficiencies::UpdateProfPoints(this);
      }
      bVar11 = is_affected_by(pCVar18,0x11);
      if (((!bVar11) && (bVar11 = is_affected(pCVar18,(int)gsn_bleeding), bVar11)) &&
         (pCVar18->position == 4)) {
        pCVar18->position = 8;
      }
      if (2 < pCVar18->position) {
        iVar13 = (int)pCVar18->max_hit;
        if (pCVar18->hit < iVar13) {
          iVar13 = hit_gain(pCVar18);
          iVar13 = iVar13 + pCVar18->hit;
        }
        pCVar18->hit = iVar13;
        sVar12 = pCVar18->max_mana;
        if (pCVar18->mana < sVar12) {
          iVar13 = mana_gain(pCVar18);
          sVar12 = (short)iVar13 + pCVar18->mana;
        }
        pCVar18->mana = sVar12;
        sVar12 = pCVar18->max_move;
        if (pCVar18->move < sVar12) {
          bVar11 = is_affected(pCVar18,(int)gsn_repose);
          iVar13 = move_gain(pCVar18);
          sVar12 = (short)(iVar13 << bVar11) + pCVar18->move;
        }
        pCVar18->move = sVar12;
      }
      if (pCVar18->position == 3) {
        update_pos(pCVar18);
      }
      if (pCVar18->position < 3) {
        damage_new(pCVar18,pCVar18,2,(int)gsn_bleeding,0x13,true,false,0,1,"slow bleeding");
      }
      fVar10 = pCVar18->talismanic + -0.0625;
      if (fVar10 <= 0.0) {
        fVar10 = 0.0;
      }
      pCVar18->talismanic = fVar10;
      bVar11 = is_npc(pCVar18);
      if ((!bVar11) && (pRVar5 = pCVar18->in_room, pRVar5 != (ROOM_INDEX_DATA *)0x0)) {
        pPVar6 = pCVar18->pcdata;
        plVar1 = pPVar6->sect_time;
        *plVar1 = *plVar1 + 1;
        plVar1 = pPVar6->sect_time + pRVar5->sector_type;
        *plVar1 = *plVar1 + 1;
      }
      bVar11 = is_npc(pCVar18);
      if (!bVar11) {
        sVar12 = pCVar18->pcdata->save_timer;
        if (sVar12 != 0) {
          pCVar18->pcdata->save_timer = sVar12 + -1;
        }
      }
      bVar11 = is_npc(pCVar18);
      if (bVar11) {
LAB_002c727a:
        bVar11 = is_npc(pCVar18);
        if ((bVar11) || (pCVar18->desc != (DESCRIPTOR_DATA *)0x0)) {
          pAVar7 = pCVar18->affected;
LAB_002c729b:
          while( true ) {
            paf = pAVar7;
            if ((paf == (AFFECT_DATA *)0x0) ||
               ((pAVar7 = paf->next, !bVar8 && (0 < pCVar18->ghost)))) goto LAB_002c7636;
            if (paf->duration < 1) break;
            if (paf->tick_fun != (AFF_FUN *)0x0) {
              (*paf->tick_fun)(pCVar18,paf);
            }
            if ((!bVar8) && (0 < pCVar18->ghost)) goto LAB_002c7636;
            paf->duration = paf->duration + -1;
            iVar13 = number_range(0,4);
            if ((iVar13 == 0) && (0 < paf->level)) {
              paf->level = paf->level + -1;
            }
          }
          if (-1 < paf->duration) {
            if ((paf->type != gsn_entwine) ||
               ((paf->owner != (CHAR_DATA *)0x0 && (pCVar18->in_room == paf->owner->in_room)))) {
              pCVar16 = paf->owner;
              if (pCVar16 == (CHAR_DATA *)0x0) {
LAB_002c749b:
                if (paf->owner == (CHAR_DATA *)0x0) {
                  pCVar15 = pCVar18->my_class;
                  if ((pCVar15 == (CClass *)0x0) &&
                     ((pCVar18->pIndexData == (MOB_INDEX_DATA *)0x0 ||
                      (pCVar15 = pCVar18->pIndexData->my_class, pCVar15 == (CClass *)0x0)))) {
                    pCVar15 = CClass::GetClass(0);
                  }
                  iVar13 = CClass::GetIndex(pCVar15);
                  if (iVar13 == 4) {
                    pCVar16 = paf->owner;
                    if (paf->owner == (CHAR_DATA *)0x0) {
                      pCVar16 = pCVar18;
                    }
                    bVar11 = trusts(pCVar18,pCVar16);
                    if (bVar11) goto LAB_002c7394;
                  }
                }
              }
              else {
                pCVar15 = pCVar16->my_class;
                if ((pCVar15 == (CClass *)0x0) &&
                   ((pCVar16->pIndexData == (MOB_INDEX_DATA *)0x0 ||
                    (pCVar15 = pCVar16->pIndexData->my_class, pCVar15 == (CClass *)0x0)))) {
                  pCVar15 = CClass::GetClass(0);
                }
                iVar13 = CClass::GetIndex(pCVar15);
                if (iVar13 != 4) goto LAB_002c749b;
LAB_002c7394:
                if (paf->aftype == 4) {
                  iVar13 = number_percent();
                  pCVar16 = paf->owner;
                  if (paf->owner == (CHAR_DATA *)0x0) {
                    pCVar16 = pCVar18;
                  }
                  iVar14 = get_skill(pCVar16,(int)gsn_channeling);
                  if (((double)iVar13 < (double)iVar14 * 0.85) &&
                     ((skill_table[paf->type].dispel & 4) == 0)) {
                    pCVar16 = paf->owner;
                    if (paf->owner == (CHAR_DATA *)0x0) {
                      pCVar16 = pCVar18;
                    }
                    check_improve(pCVar16,(int)gsn_channeling,true,1);
                    pCVar16 = paf->owner;
                    if (pCVar16 == (CHAR_DATA *)0x0 || pCVar18 == pCVar16) {
                      pcVar17 = 
                      "You feel invigorated as your $t supplication is renewed by your deity.";
                      pCVar16 = (CHAR_DATA *)0x0;
                    }
                    else {
                      pcVar17 = "You feel invigorated as $N renews your $t supplication.";
                    }
                    act(pcVar17,pCVar18,skill_table[paf->type].name,pCVar16,3);
                    paf->duration = paf->init_duration;
                    iVar13 = (int)pCVar18->mana - (int)skill_table[paf->type].min_mana;
                    sVar12 = (short)iVar13;
                    if (iVar13 < 1) {
                      sVar12 = 0;
                    }
                    pCVar18->mana = sVar12;
                    goto LAB_002c729b;
                  }
                }
              }
              if (((pAVar7 == (AFFECT_DATA *)0x0) || (pAVar7->type != paf->type)) ||
                 (0 < pAVar7->duration)) {
                if ((0 < (long)paf->type) &&
                   (bVar11 = str_cmp(skill_table[paf->type].msg_off,""), bVar11)) {
                  send_to_char(skill_table[paf->type].msg_off,pCVar18);
                  send_to_char("\n\r",pCVar18);
                }
                if ((((long)paf->type != 0) &&
                    (bVar11 = str_cmp(skill_table[paf->type].room_msg_off,""), bVar11)) &&
                   (bVar11 = is_awake(pCVar18), bVar11)) {
                  act(skill_table[paf->type].room_msg_off,pCVar18,(void *)0x0,(void *)0x0,0);
                }
              }
            }
            affect_remove(pCVar18,paf);
            goto LAB_002c729b;
          }
          if (paf->tick_fun != (AFF_FUN *)0x0) {
            (*paf->tick_fun)(pCVar18,paf);
          }
          if ((bVar8) || (pCVar18->ghost < 1)) goto LAB_002c729b;
        }
LAB_002c7636:
        if ((((bVar8) || (pCVar18->ghost < 1)) && (bVar11 = is_npc(pCVar18), !bVar11)) &&
           ((pCVar18->in_room != (ROOM_INDEX_DATA *)0x0 && (pCVar18->in_room->sector_type == 0xd))))
        {
          iVar13 = dice((int)(short)(pCVar18->level - (pCVar18->level >> 0xf)) >> 1,2);
          damage_new(pCVar18,pCVar18,iVar13,(int)gsn_bleeding,4,true,false,0,1,"the searing heat*");
        }
      }
      else {
        obj = get_eq_char(pCVar18,0);
        if (((obj != (OBJ_DATA *)0x0) && (obj->item_type == 1)) &&
           (iVar13 = obj->value[2], 0 < iVar13)) {
          obj->value[2] = iVar13 + -1;
          if ((iVar13 + -1 == 0) && (pRVar5 = pCVar18->in_room, pRVar5 != (ROOM_INDEX_DATA *)0x0)) {
            sVar12 = pRVar5->light;
            if (pRVar5->light < 4) {
              sVar12 = 3;
            }
            pRVar5->light = sVar12 + -3;
            act("$p goes out.",pCVar18,obj,(void *)0x0,0);
            act("$p flickers and goes out.",pCVar18,obj,(void *)0x0,3);
            extract_obj(obj);
          }
          else if ((iVar13 < 7) && (pCVar18->in_room != (ROOM_INDEX_DATA *)0x0)) {
            act("$p flickers.",pCVar18,obj,(void *)0x0,3);
          }
        }
        uVar3 = pCVar18->timer;
        pCVar18->timer = uVar3 + 1;
        if ((((short)(uVar3 + 1) < 0x19) || (bVar11 = is_heroimm(pCVar18), bVar11)) ||
           ((bVar11 = is_immortal(pCVar18), bVar11 ||
            ((((pCVar18->act[0] & 0x8000) != 0 || (pCVar18->was_in_room != (ROOM_INDEX_DATA *)0x0))
             || (pCVar18->in_room == (ROOM_INDEX_DATA *)0x0)))))) {
          gain_condition(pCVar18,0,-1);
          gain_condition(pCVar18,2,1);
          gain_condition(pCVar18,3,1);
          goto LAB_002c727a;
        }
        pCVar18->was_in_room = pCVar18->in_room;
        if (pCVar18->fighting != (CHAR_DATA *)0x0) {
          stop_fighting(pCVar18,true);
        }
        act("$n disappears into the void.",pCVar18,(void *)0x0,(void *)0x0,0);
        send_to_char("You disappear into the void.\n\r",pCVar18);
        if (1 < pCVar18->level) {
          save_char_obj(pCVar18);
        }
        pCVar18->pause = 0;
        do_quit_new(pCVar18,"",true);
      }
      pCVar18 = pCVar4;
      pCVar16 = char_list;
    } while (pCVar4 != (CHAR_DATA *)0x0);
  }
  while (pCVar18 = pCVar16, pCVar18 != (CHAR_DATA *)0x0) {
    pCVar16 = pCVar18->next;
    if ((pCVar18->desc != (DESCRIPTOR_DATA *)0x0) &&
       (sVar12 = pCVar18->desc->descriptor,
       (int)sVar12 +
       (((int)sVar12 / 3 + ((int)sVar12 >> 0x1f)) - (int)((long)sVar12 * 0x55555556 >> 0x3f)) * -3
       == save_number)) {
      save_char_obj(pCVar18);
    }
  }
  return;
}

Assistant:

void char_update(void)
{
	CHAR_DATA *ch;
	CHAR_DATA *ch_next;
	CHAR_DATA *ch_quit;
	int hgain;
	bool ghost= false;

	ch_quit = nullptr;

	/* update save counter */
	save_number++;

	if (save_number > 2)
		save_number = 0;

	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		CHAR_DATA *master;
		AFFECT_DATA *paf;
		AFFECT_DATA *paf_next;
		bool charm_gone;

		ch_next = ch->next;
		master = nullptr;

		if (is_npc(ch)
			&& (sun == SolarPosition::Sunrise || sun == SolarPosition::Daylight)
			&& ch->in_room
			&& number_percent() < 90
			&& !is_affected_by(ch, AFF_SLEEP)
			&& ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_DIURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_NOCTURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}
		else if (is_npc(ch) && sun >= SolarPosition::Sunset && ch->in_room && number_percent() < 90 && ch->fighting == nullptr)
		{
			if (IS_SET(ch->act, ACT_NOCTURNAL) && is_affected_by(ch, AFF_NOSHOW))
				REMOVE_BIT(ch->affected_by, AFF_NOSHOW);
			else if (IS_SET(ch->act, ACT_DIURNAL) && !is_affected_by(ch, AFF_NOSHOW))
				SET_BIT(ch->affected_by, AFF_NOSHOW);
		}

		if (ch->pause > 0)
			ch->pause--;

		if (is_npc(ch) && ch->hit < 0 && ch->in_room)
		{
			RS.Logger.Warn("{} in {} has HP {}", ch->name, ch->in_room->vnum, ch->hit);
		}

		if (ch->ghost > 0)
		{
			ch->ghost--;

			switch (ch->ghost)
			{
				case 4:
					send_to_char("Your body starts to collect itself.\n\r", ch);
					break;
				case 2:
					send_to_char("Your body begins to solidify.\n\r", ch);
					break;
				case 0:
					send_to_char("You are no longer a ghost.\n\r", ch);
					break;
			}
		}

		if (ch->bounty_timer > 0)
			ch->bounty_timer--;

		if (ch->ghost > 0)
			ghost = true;

		/* LOWBIE LEVELLING */
		if (!is_npc(ch) && ch->level < 20 && (ch->in_room->vnum > 24599 || ch->in_room->vnum < 24500))
		{
			char buf1[MSL];
			while (ch->level < 20)
			{
				ch->level++;
				advance_level(ch, true);
			}

			ch->exp = exp_per_level(ch) * (ch->level - 1);

			colorconv(buf1, "{RYou feel more experienced as you depart the Adventurer's Academy!{x\n\r", ch);
			send_to_char(buf1, ch);

			colorconv(buf1, "{GYou are now level 20.{x\n\r", ch);
			send_to_char(buf1, ch);

			if (ch->pet)
			{
				sprintf(buf1, "Remember, you can ask your familiar questions.  For example, 'say %s, how do I get to my guild?'.\n\r", ch->pet->short_descr);
				send_to_char(buf1, ch);
			}
		}

		if (!is_npc(ch))
			ch->Profs()->UpdateProfPoints();

		if (!is_affected_by(ch, AFF_SLEEP) && is_affected(ch, gsn_bleeding) && ch->position == POS_SLEEPING)
			ch->position = POS_STANDING;

		if (ch->position >= POS_STUNNED)
		{
			if (ch->hit < ch->max_hit) /* Some regen stuff */
			{
				hgain = hit_gain(ch);
				ch->hit += hgain;
			}
			else
			{
				ch->hit = ch->max_hit;
			}

			if (ch->mana < ch->max_mana)
				ch->mana += mana_gain(ch);
			else
				ch->mana = ch->max_mana;

			if (ch->move < ch->max_move)
				ch->move += (is_affected(ch, gsn_repose)) ? (move_gain(ch) * 2) : (move_gain(ch));
			else
				ch->move = ch->max_move;
		}

		if (ch->position == POS_STUNNED)
			update_pos(ch);

		if (ch->position < POS_STUNNED)
			damage_new(ch, ch, 2, gsn_bleeding, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "slow bleeding");

		ch->talismanic = std::max((double)0, ch->talismanic - 0.0625);

		if (!is_npc(ch) && ch->in_room)
		{
			ch->pcdata->sect_time[0]++;
			ch->pcdata->sect_time[ch->in_room->sector_type]++;
		}

		if (!is_npc(ch) && ch->pcdata->save_timer)
			ch->pcdata->save_timer--;

		if (!is_npc(ch) /* && !is_immortal(ch) */)
		{
			OBJ_DATA *obj;

			if ((obj = get_eq_char(ch, WEAR_LIGHT)) != nullptr && obj->item_type == ITEM_LIGHT && obj->value[2] > 0)
			{
				if (--obj->value[2] == 0 && ch->in_room != nullptr)
				{
					ch->in_room->light = std::max(0, ch->in_room->light - 3);
					act("$p goes out.", ch, obj, nullptr, TO_ROOM);
					act("$p flickers and goes out.", ch, obj, nullptr, TO_CHAR);
					extract_obj(obj);
				}
				else if (obj->value[2] <= 5 && ch->in_room != nullptr)
				{
					act("$p flickers.", ch, obj, nullptr, TO_CHAR);
				}
			}

			ch->timer++;

			if (ch->timer >= 25 && !is_heroimm(ch) && !is_immortal(ch) && !IS_SET(ch->act, PLR_NOVOID))
			{
				if (ch->was_in_room == nullptr && ch->in_room != nullptr)
				{
					ch->was_in_room = ch->in_room;

					if (ch->fighting != nullptr)
						stop_fighting(ch, true);

					act("$n disappears into the void.", ch, nullptr, nullptr, TO_ROOM);
					send_to_char("You disappear into the void.\n\r", ch);

					if (ch->level > 1)
						save_char_obj(ch);

					ch->pause = 0;
					do_quit_new(ch, "", true);
					continue;
				}
			}

			gain_condition(ch, COND_DRUNK, -1);
			gain_condition(ch, COND_THIRST, 1);
			gain_condition(ch, COND_HUNGER, 1);
		}

		if (!is_npc(ch) && ch->desc == nullptr)
		{
			/* nothing */
		}
		else
		{
			for (paf = ch->affected; paf != nullptr; paf = paf_next)
			{
				paf_next = paf->next;
				charm_gone= false;

				if (!ghost && ch->ghost > 0)
					break;

				if (paf->duration > 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ch || (!ghost && ch->ghost > 0))
						break;

					if (!paf)
						continue;

					paf->duration--;

					if (number_range(0, 4) == 0 && paf->level > 0)
						paf->level--; /* spell strength fades with time */
				}
				else if (paf->duration < 0)
				{
					if (paf->tick_fun)
						(*paf->tick_fun)(ch, paf);

					if (!ghost && ch->ghost > 0)
						break;
				}
				else if (paf->type == gsn_entwine
					&& (paf->owner == nullptr || (paf->owner && ch->in_room != paf->owner->in_room)))
				{
					affect_remove(ch, paf);
				}
				else
				{
					if (((paf->owner && paf->owner->Class()->GetIndex() == CLASS_PALADIN)
							|| (!paf->owner && ch->Class()->GetIndex() == CLASS_PALADIN)
							&& trusts(ch, paf->owner ? paf->owner : ch))
						&& paf->aftype == AFT_COMMUNE)
					{
						if (number_percent() < (get_skill(paf->owner ? paf->owner : ch, gsn_channeling) * .85)
							&& !(skill_table[paf->type].dispel & CAN_CLEANSE))
						{
							check_improve(paf->owner ? paf->owner : ch, gsn_channeling, true, 1);

							if (!paf->owner || ch == paf->owner)
							{
								act("You feel invigorated as your $t supplication is renewed by your deity.", ch, skill_table[paf->type].name, 0, TO_CHAR);
							}
							else
							{
								act("You feel invigorated as $N renews your $t supplication.", ch, skill_table[paf->type].name, paf->owner, TO_CHAR);
							}

							paf->duration = paf->init_duration;
							ch->mana = std::max(ch->mana - skill_table[paf->type].min_mana, 0);
							continue;
						}
					}

					if (paf_next == nullptr || paf_next->type != paf->type || paf_next->duration > 0)
					{
						if (paf->type > 0 && str_cmp(skill_table[paf->type].msg_off, ""))
						{
							send_to_char(skill_table[paf->type].msg_off, ch);
							send_to_char("\n\r", ch);
						}

						if (paf->type && str_cmp(skill_table[paf->type].room_msg_off, "") && is_awake(ch))
							act(skill_table[paf->type].room_msg_off, ch, 0, 0, TO_ROOM);
					}
					affect_remove(ch, paf);
				}
			}
		}

		if (!ch)
			continue;

		if (!ghost && ch->ghost > 0)
			continue;

		/*
		 * Careful with the damages here,
		 *   MUST NOT refer to ch after damage taken,
		 *   as it may be lethal damage (on NPC).
		 *
		 *   You must add a line to the poison check in damage_new in fight.c!
		 */

		if (!is_npc(ch) && ch->in_room && ch->in_room->sector_type == SECT_BURNING)
			damage_new(ch, ch, dice(ch->level / 2, 2), gsn_bleeding, DAM_FIRE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the searing heat*");
	}
	/*
	 * Autosave and autoquit.
	 * Check that these chars still exist.
	 */
	for (ch = char_list; ch != nullptr; ch = ch_next)
	{
		ch_next = ch->next;

		if (ch->desc != nullptr && ch->desc->descriptor % 3 == save_number)
			save_char_obj(ch);
	}
}